

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O0

CropLayerParams * __thiscall
google::protobuf::Arena::DoCreateMessage<CoreML::Specification::CropLayerParams>(Arena *this)

{
  void *ptr;
  CropLayerParams *pCVar1;
  Arena *local_18;
  Arena *local_10;
  Arena *this_local;
  
  local_10 = this;
  ptr = AllocateInternal(this,0x38,8,(_func_void_void_ptr *)0x0,
                         (type_info *)&CoreML::Specification::CropLayerParams::typeinfo);
  local_18 = this;
  pCVar1 = InternalHelper<CoreML::Specification::CropLayerParams>::
           Construct<google::protobuf::Arena*>(ptr,&local_18);
  return pCVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE T* DoCreateMessage(Args&&... args) {
    return InternalHelper<T>::Construct(
        AllocateInternal(sizeof(T), alignof(T),
                         internal::ObjectDestructor<
                             InternalHelper<T>::is_destructor_skippable::value,
                             T>::destructor,
                         RTTI_TYPE_ID(T)),
        this, std::forward<Args>(args)...);
  }